

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::createAndUploadTexture
          (TextureGather2DCase *this)

{
  PtrData<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> data;
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  RenderContext *context;
  float extraout_var;
  Texture2D *pTVar5;
  ConstPixelBufferAccess *dst;
  CommandLine *this_00;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined8 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  int local_394;
  Vector<int,_2> local_350;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  LogImage local_2c8;
  MessageBuilder local_238;
  ConstPixelBufferAccess *local_b8;
  PixelBufferAccess *level;
  int local_a8;
  int levelNdx;
  int levelEnd;
  int levelBegin;
  Texture2D *refTexture;
  TextureFormat local_88;
  PtrData<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> local_80;
  PtrData<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *local_70;
  undefined1 local_60 [8];
  TextureFormatInfo texFmtInfo;
  Functions *gl;
  RenderContext *renderCtx;
  TextureGather2DCase *this_local;
  
  context = gles31::Context::getRenderContext
                      ((this->super_TextureGatherCase).super_TestCase.m_context);
  texFmtInfo.lookupBias.m_data[2] = (float)(*context->_vptr_RenderContext[3])();
  texFmtInfo.lookupBias.m_data[3] = extraout_var;
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)local_60,&(this->super_TextureGatherCase).m_textureFormat);
  pTVar5 = (Texture2D *)operator_new(0x70);
  local_88 = (this->super_TextureGatherCase).m_textureFormat;
  dVar2 = glu::getInternalFormat(local_88);
  iVar3 = tcu::Vector<int,_2>::x(&this->m_textureSize);
  iVar4 = tcu::Vector<int,_2>::y(&this->m_textureSize);
  glu::Texture2D::Texture2D(pTVar5,context,dVar2,iVar3,iVar4);
  de::DefaultDeleter<glu::Texture2D>::DefaultDeleter
            ((DefaultDeleter<glu::Texture2D> *)((long)&refTexture + 3));
  de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::MovePtr();
  local_70 = de::details::MovePtr::operator_cast_to_PtrData(&local_80,(MovePtr *)pTVar5);
  data._8_4_ = in_stack_fffffffffffffc30;
  data.ptr = (Texture2D *)in_stack_fffffffffffffc28;
  data._12_4_ = in_stack_fffffffffffffc34;
  de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator=
            (&this->m_texture,data);
  de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~MovePtr
            ((MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)&local_80);
  pTVar5 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  _levelEnd = glu::Texture2D::getRefTexture(pTVar5);
  levelNdx = (this->super_TextureGatherCase).m_baseLevel;
  bVar1 = isMipmapFilter((this->super_TextureGatherCase).m_minFilter);
  if ((bVar1) && (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    local_394 = tcu::TextureLevelPyramid::getNumLevels(&_levelEnd->super_TextureLevelPyramid);
  }
  else {
    local_394 = (this->super_TextureGatherCase).m_baseLevel + 1;
  }
  local_a8 = local_394;
  for (level._4_4_ = levelNdx; level._4_4_ < local_a8; level._4_4_ = level._4_4_ + 1) {
    tcu::Texture2D::allocLevel(_levelEnd,level._4_4_);
    dst = &tcu::TextureLevelPyramid::getLevel(&_levelEnd->super_TextureLevelPyramid,level._4_4_)->
           super_ConstPixelBufferAccess;
    local_b8 = dst;
    this_00 = tcu::TestContext::getCommandLine
                        ((this->super_TextureGatherCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    dVar2 = tcu::CommandLine::getBaseSeed(this_00);
    fillWithRandomColorTiles
              ((PixelBufferAccess *)dst,(Vec4 *)local_60,(Vec4 *)(texFmtInfo.valueMin.m_data + 2),
               dVar2);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    de::toString<int>(&local_308,(int *)((long)&level + 4));
    std::operator+(&local_2e8,"InputTextureLevel",&local_308);
    de::toString<int>(&local_348,(int *)((long)&level + 4));
    std::operator+(&local_328,"Input texture, level ",&local_348);
    tcu::LogImage::LogImage
              (&local_2c8,&local_2e8,&local_328,local_b8,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_2c8);
    tcu::TestLog::operator<<(&local_238,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_238,(char (*) [31])"Note: texture level\'s size is ");
    iVar3 = tcu::ConstPixelBufferAccess::getWidth(local_b8);
    iVar4 = tcu::ConstPixelBufferAccess::getHeight(local_b8);
    tcu::Vector<int,_2>::Vector(&local_350,iVar3,iVar4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_350);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_238);
    tcu::LogImage::~LogImage(&local_2c8);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
  }
  swizzleTexture(&this->m_swizzledTexture,_levelEnd,
                 &(this->super_TextureGatherCase).m_textureSwizzle);
  (**(code **)(texFmtInfo.lookupBias.m_data._8_8_ + 8))(0x84c0);
  pTVar5 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  (*pTVar5->_vptr_Texture2D[2])();
  return;
}

Assistant:

void TextureGather2DCase::createAndUploadTexture (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::Texture2D>(new glu::Texture2D(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize.x(), m_textureSize.y()));

	{
		tcu::Texture2D&		refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			refTexture.allocLevel(levelNdx);
			const PixelBufferAccess& level = refTexture.getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed());
			m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
							   << TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}